

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O0

void cvui::render::trackbarSteps
               (cvui_block_t *theBlock,int theState,Rect *theShape,double theValue,
               TrackbarParams *theParams,Rect *theWorkingArea)

{
  bool bVar1;
  int _x;
  longdouble lVar2;
  longdouble local_e4;
  Point_<int> local_d4 [2];
  Point_<int> local_c0;
  _InputOutputArray local_b8;
  Point_<int> local_9c;
  Point aPoint2;
  Point aPoint1;
  int aPixelX;
  longdouble aValue;
  longdouble aFixedStep;
  undefined1 local_60 [7];
  bool aDiscrete;
  Scalar aColor;
  Point aBarTopLeft;
  Rect *theWorkingArea_local;
  TrackbarParams *theParams_local;
  double theValue_local;
  Rect *theShape_local;
  int theState_local;
  cvui_block_t *theBlock_local;
  
  cv::Point_<int>::Point_
            ((Point_<int> *)(aColor.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 3),
             theWorkingArea->x,theWorkingArea->y + theWorkingArea->height / 2);
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_60,81.0,81.0,81.0,0.0);
  bVar1 = internal::bitsetHas(*(uint *)(theParams + 0x34),4);
  if (bVar1) {
    local_e4 = *(longdouble *)(theParams + 0x20);
  }
  else {
    local_e4 = (*(longdouble *)(theParams + 0x10) - *(longdouble *)theParams) / (longdouble)20.0;
  }
  for (unique0x00006f00 = *(longdouble *)theParams;
      stack0xffffffffffffff78 <= *(longdouble *)(theParams + 0x10);
      register0x00001110 = stack0xffffffffffffff78 + local_e4) {
    lVar2 = stack0xffffffffffffff78;
    _x = internal::trackbarValueToXPixel(theParams,theShape,stack0xffffffffffffff78);
    cv::Point_<int>::Point_
              (&aPoint2,_x,aColor.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3]._4_4_);
    cv::Point_<int>::Point_
              (&local_9c,_x,aColor.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3]._4_4_ + -3);
    cv::_InputOutputArray::_InputOutputArray(&local_b8,&theBlock->where);
    cv::Point_<int>::Point_(&local_c0,&aPoint2);
    cv::Point_<int>::Point_(local_d4,&local_9c);
    cv::line(&local_b8,&local_c0,local_d4,local_60,1,8,
             (unkuint10)(uint6)((unkuint10)lVar2 >> 0x20) << 0x20);
    cv::_InputOutputArray::~_InputOutputArray(&local_b8);
  }
  return;
}

Assistant:

void trackbarSteps(cvui_block_t& theBlock, int theState, cv::Rect& theShape, double theValue, const internal::TrackbarParams &theParams, cv::Rect& theWorkingArea) {
		cv::Point aBarTopLeft(theWorkingArea.x, theWorkingArea.y + theWorkingArea.height / 2);
		cv::Scalar aColor(0x51, 0x51, 0x51);

		bool aDiscrete = internal::bitsetHas(theParams.options, cvui::TRACKBAR_DISCRETE);
		long double aFixedStep = aDiscrete ? theParams.step : (theParams.max - theParams.min) / 20;

		// TODO: check min, max and step to prevent infinite loop.
		for (long double aValue = theParams.min; aValue <= theParams.max; aValue += aFixedStep) {
			int aPixelX = internal::trackbarValueToXPixel(theParams, theShape, aValue);
			cv::Point aPoint1(aPixelX, aBarTopLeft.y);
			cv::Point aPoint2(aPixelX, aBarTopLeft.y - 3);
			cv::line(theBlock.where, aPoint1, aPoint2, aColor);
		}
	}